

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O3

string * __thiscall jbcoin::STTx::getFullText_abi_cxx11_(string *__return_storage_ptr__,STTx *this)

{
  int in_ECX;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  local_48 = *(undefined8 *)(this->tid_).pn;
  uStack_40 = *(undefined8 *)((this->tid_).pn + 2);
  local_38 = *(undefined8 *)((this->tid_).pn + 4);
  uStack_30 = *(undefined8 *)((this->tid_).pn + 6);
  strHex<unsigned_char_const*>(&local_68,(jbcoin *)&local_48,&DAT_00000020,in_ECX);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  STObject::getFullText_abi_cxx11_(&local_68,&this->super_STObject);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
STTx::getFullText () const
{
    std::string ret = "\"";
    ret += to_string (getTransactionID ());
    ret += "\" = {";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}